

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O0

void nn_invalid_enum_value(nn_parse_context *ctx,int opt_index,char *argument)

{
  long *local_30;
  nn_enum_item *items;
  nn_option *opt;
  char *argument_local;
  int opt_index_local;
  nn_parse_context *ctx_local;
  
  local_30 = (long *)ctx->options[opt_index].pointer;
  fprintf(_stderr,"%s: Invalid value ``%s\'\' for",*ctx->argv,argument);
  nn_print_option(ctx,opt_index,(FILE *)_stderr);
  fprintf(_stderr,". Options are:\n");
  for (; *local_30 != 0; local_30 = local_30 + 2) {
    fprintf(_stderr,"    %s\n",*local_30);
  }
  exit(1);
}

Assistant:

static void nn_invalid_enum_value (struct nn_parse_context *ctx,
    int opt_index, char *argument)
{
    struct nn_option *opt;
    struct nn_enum_item *items;

    opt = &ctx->options[opt_index];
    items = (struct nn_enum_item *)opt->pointer;
    fprintf (stderr, "%s: Invalid value ``%s'' for", ctx->argv[0], argument);
    nn_print_option (ctx, opt_index, stderr);
    fprintf (stderr, ". Options are:\n");
    for (;items->name; ++items) {
        fprintf (stderr, "    %s\n", items->name);
    }
    exit (1);
}